

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_add.cxx
# Opt level: O0

Fl_Menu_Item * array_insert(Fl_Menu_Item *array,int size,int n,char *text,int flags)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Fl_Menu_Item *pFVar3;
  char *local_48;
  Fl_Menu_Item *m;
  Fl_Menu_Item *newarray;
  int flags_local;
  char *text_local;
  int n_local;
  int size_local;
  Fl_Menu_Item *array_local;
  
  pFVar3 = local_array;
  _n_local = array;
  if ((array == local_array) && (local_array_alloc <= size)) {
    local_array_alloc = size << 1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)local_array_alloc;
    uVar2 = SUB168(auVar1 * ZEXT816(0x38),0);
    if (SUB168(auVar1 * ZEXT816(0x38),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    _n_local = (Fl_Menu_Item *)operator_new__(uVar2);
    memmove(_n_local,array,(long)size * 0x38);
    pFVar3 = _n_local;
    if (local_array != (Fl_Menu_Item *)0x0) {
      operator_delete__(local_array);
    }
  }
  local_array = pFVar3;
  memmove(_n_local + (long)n + 1,_n_local + n,(long)(size - n) * 0x38);
  pFVar3 = _n_local + n;
  if (text == (char *)0x0) {
    local_48 = (char *)0x0;
  }
  else {
    local_48 = strdup(text);
  }
  pFVar3->text = local_48;
  pFVar3->shortcut_ = 0;
  pFVar3->callback_ = (Fl_Callback *)0x0;
  pFVar3->user_data_ = (void *)0x0;
  pFVar3->flags = flags;
  pFVar3->labelcolor_ = 0;
  pFVar3->labelsize_ = 0;
  pFVar3->labeltype_ = '\0';
  pFVar3->labelfont_ = 0;
  return _n_local;
}

Assistant:

static Fl_Menu_Item* array_insert(
  Fl_Menu_Item* array,  // array to modify
  int size,             // size of array
  int n,                // index of new insert position
  const char *text,     // text of new item (copy is made)
  int flags             // flags for new item
) {
  if (array == local_array && size >= local_array_alloc) {
    local_array_alloc = 2*size;
    Fl_Menu_Item* newarray = new Fl_Menu_Item[local_array_alloc];
    memmove(newarray, array, size*sizeof(Fl_Menu_Item));
    delete[] local_array;
    local_array = array = newarray;
  }
  // move all the later items:
  memmove(array+n+1, array+n, sizeof(Fl_Menu_Item)*(size-n));
  // create the new item:
  Fl_Menu_Item* m = array+n;
  m->text = text ? strdup(text) : 0;
  m->shortcut_ = 0;
  m->callback_ = 0;
  m->user_data_ = 0;
  m->flags = flags;
  m->labeltype_ = m->labelsize_ = m->labelcolor_ = 0;
  m->labelfont_ = FL_HELVETICA; 
  return array;
}